

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O1

void leveldb::_Test_SequenceNumberRecovery::_RunIt(void)

{
  _Test_SequenceNumberRecovery t;
  CorruptionTest local_b0;
  
  CorruptionTest::CorruptionTest(&local_b0);
  _Run((_Test_SequenceNumberRecovery *)&local_b0);
  CorruptionTest::~CorruptionTest(&local_b0);
  return;
}

Assistant:

TEST(CorruptionTest, SequenceNumberRecovery) {
  ASSERT_OK(db_->Put(WriteOptions(), "foo", "v1"));
  ASSERT_OK(db_->Put(WriteOptions(), "foo", "v2"));
  ASSERT_OK(db_->Put(WriteOptions(), "foo", "v3"));
  ASSERT_OK(db_->Put(WriteOptions(), "foo", "v4"));
  ASSERT_OK(db_->Put(WriteOptions(), "foo", "v5"));
  RepairDB();
  Reopen();
  std::string v;
  ASSERT_OK(db_->Get(ReadOptions(), "foo", &v));
  ASSERT_EQ("v5", v);
  // Write something.  If sequence number was not recovered properly,
  // it will be hidden by an earlier write.
  ASSERT_OK(db_->Put(WriteOptions(), "foo", "v6"));
  ASSERT_OK(db_->Get(ReadOptions(), "foo", &v));
  ASSERT_EQ("v6", v);
  Reopen();
  ASSERT_OK(db_->Get(ReadOptions(), "foo", &v));
  ASSERT_EQ("v6", v);
}